

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

boolean revive_corpse(obj *corpse)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  monst *pmVar6;
  bool bVar7;
  char *local_4a8;
  char *local_488;
  char *local_478;
  monst *local_468;
  char local_458 [8];
  char sackname_2 [256];
  char sackname_1 [256];
  char sackname [256];
  monst *mtmp2;
  obj *poStack_140;
  int container_where;
  obj *container;
  char cname_buf [256];
  char *cname;
  xchar where;
  boolean chewed;
  monst *pmStack_28;
  boolean is_uwep;
  monst *mcarry;
  monst *mtmp;
  obj *corpse_local;
  
  poStack_140 = (obj *)0x0;
  mtmp2._4_4_ = 0;
  cVar1 = corpse->where;
  bVar7 = corpse == uwep;
  pcVar4 = strcpy((char *)&container,"bite-covered ");
  pcVar4 = eos(pcVar4);
  cname_buf._248_8_ = pcVar4;
  pcVar5 = corpse_xname(corpse,'\x01');
  strcpy(pcVar4,pcVar5);
  if (cVar1 == '\x04') {
    local_468 = (corpse->v).v_ocarry;
  }
  else {
    local_468 = (monst *)0x0;
  }
  pmStack_28 = local_468;
  if (cVar1 == '\x02') {
    poStack_140 = (corpse->v).v_nexthere;
    pmVar6 = get_container_location(poStack_140,(int *)((long)&mtmp2 + 4),(int *)0x0);
    if ((mtmp2._4_4_ == 4) && (pmVar6 != (monst *)0x0)) {
      pmStack_28 = pmVar6;
    }
  }
  pmVar6 = revive(corpse);
  if (pmVar6 == (monst *)0x0) {
    return '\0';
  }
  bVar2 = pmVar6->mhp < pmVar6->mhpmax;
  if (bVar2) {
    cname_buf._248_8_ = &container;
  }
  switch(cVar1) {
  case '\x01':
    if ((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0) {
      if (bVar2) {
        local_478 = Adjmonnam(pmVar6,"bite-covered");
      }
      else {
        local_478 = Monnam(pmVar6);
      }
      pline("%s rises from the dead!",local_478);
    }
    break;
  case '\x02':
    if (((mtmp2._4_4_ == 4) && ((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0)) &&
       (pmStack_28 != (monst *)0x0)) {
      if (pmStack_28->wormno == '\0') {
        if ((viz_array[pmStack_28->my][pmStack_28->mx] & 2U) == 0) {
          if (((((u.uprops[0x1e].intrinsic != 0) ||
                (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                 (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
               ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
              ((u.uprops[0x40].intrinsic == 0 &&
               ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
             ((pmStack_28->data->mflags3 & 0x200) == 0)) goto LAB_00196629;
          bVar3 = viz_array[pmStack_28->my][pmStack_28->mx] & 1;
          goto joined_r0x00196509;
        }
      }
      else {
        bVar3 = worm_known(level,pmStack_28);
joined_r0x00196509:
        if (bVar3 == 0) goto LAB_00196629;
      }
      if ((((((*(uint *)&pmStack_28->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0))
           || (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&pmStack_28->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&pmStack_28->field_0x60 >> 9 & 1) == 0)) &&
          ((((byte)u._1052_1_ >> 5 & 1) == 0 && (poStack_140 != (obj *)0x0)))))) {
        pcVar4 = mon_nam(pmStack_28);
        pcVar4 = s_suffix(pcVar4);
        pcVar5 = xname(poStack_140);
        sprintf(sackname_1 + 0xf8,"%s %s",pcVar4,pcVar5);
        pcVar4 = Amonnam(pmVar6);
        pline("%s writhes out of %s!",pcVar4,sackname_1 + 0xf8);
        return '\x01';
      }
    }
LAB_00196629:
    if ((mtmp2._4_4_ == 3) && (poStack_140 != (obj *)0x0)) {
      pcVar4 = xname(poStack_140);
      pcVar4 = an(pcVar4);
      strcpy(sackname_2 + 0xf8,pcVar4);
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        local_4a8 = Amonnam(pmVar6);
      }
      else {
        local_4a8 = "Something";
      }
      pcVar4 = locomotion(pmVar6->data,"writhes");
      pline("%s %s out of %s in your pack!",local_4a8,pcVar4,sackname_2 + 0xf8);
    }
    else if ((mtmp2._4_4_ == 1) &&
            ((poStack_140 != (obj *)0x0 && ((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0)))) {
      pcVar4 = xname(poStack_140);
      pcVar4 = an(pcVar4);
      strcpy(local_458,pcVar4);
      pcVar4 = Amonnam(pmVar6);
      pline("%s escapes from %s!",pcVar4,local_458);
    }
    break;
  case '\x03':
    if (bVar7) {
      pline("The %s writhes out of your grasp!",cname_buf._248_8_);
    }
    else {
      pline("You feel squirming in your backpack!");
    }
    break;
  case '\x04':
    if ((viz_array[pmVar6->my][pmVar6->mx] & 2U) == 0) {
      return '\x01';
    }
    if (pmStack_28->wormno == '\0') {
      if ((viz_array[pmStack_28->my][pmStack_28->mx] & 2U) != 0) goto LAB_00196261;
      if ((((u.uprops[0x1e].intrinsic == 0) &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         (((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          ((pmStack_28->data->mflags3 & 0x200) != 0)))) {
        bVar3 = viz_array[pmStack_28->my][pmStack_28->mx] & 1;
        goto joined_r0x0019625b;
      }
    }
    else {
      bVar3 = worm_known(level,pmStack_28);
joined_r0x0019625b:
      if (bVar3 != 0) {
LAB_00196261:
        if (((((((*(uint *)&pmStack_28->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)
               ) || (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)
             ) && (((*(uint *)&pmStack_28->field_0x60 >> 7 & 1) == 0 &&
                   ((*(uint *)&pmStack_28->field_0x60 >> 9 & 1) == 0)))) &&
           (((byte)u._1052_1_ >> 5 & 1) == 0)) {
          pcVar4 = mon_nam(pmStack_28);
          pcVar5 = an((char *)cname_buf._248_8_);
          pline("Startled, %s drops %s as it revives!",pcVar4,pcVar5);
          return '\x01';
        }
      }
    }
    if (bVar2) {
      local_488 = Adjmonnam(pmVar6,"bite-covered");
    }
    else {
      local_488 = Monnam(pmVar6);
    }
    pline("%s suddenly appears!",local_488);
    break;
  default:
    impossible("revive_corpse: lost corpse @ %d",(ulong)(uint)(int)cVar1);
  }
  return '\x01';
}

Assistant:

boolean revive_corpse(struct obj *corpse)
{
    struct monst *mtmp, *mcarry;
    boolean is_uwep, chewed;
    xchar where;
    char *cname, cname_buf[BUFSZ];
    struct obj *container = NULL;
    int container_where = 0;
    
    where = corpse->where;
    is_uwep = corpse == uwep;
    cname = eos(strcpy(cname_buf, "bite-covered "));
    strcpy(cname, corpse_xname(corpse, TRUE));
    mcarry = (where == OBJ_MINVENT) ? corpse->ocarry : 0;

    if (where == OBJ_CONTAINED) {
    	struct monst *mtmp2 = NULL;
	container = corpse->ocontainer;
    	mtmp2 = get_container_location(container, &container_where, NULL);
	/* container_where is the outermost container's location even if nested */
	if (container_where == OBJ_MINVENT && mtmp2) mcarry = mtmp2;
    }
    mtmp = revive(corpse);	/* corpse is gone if successful */

    if (mtmp) {
	chewed = (mtmp->mhp < mtmp->mhpmax);
	if (chewed) cname = cname_buf;	/* include "bite-covered" prefix */
	switch (where) {
	    case OBJ_INVENT:
		if (is_uwep)
		    pline("The %s writhes out of your grasp!", cname);
		else
		    pline("You feel squirming in your backpack!");
		break;

	    case OBJ_FLOOR:
		if (cansee(mtmp->mx, mtmp->my))
		    pline("%s rises from the dead!", chewed ?
			  Adjmonnam(mtmp, "bite-covered") : Monnam(mtmp));
		break;

	    case OBJ_MINVENT:		/* probably a nymph's */
		if (cansee(mtmp->mx, mtmp->my)) {
		    if (canseemon(level, mcarry))
			pline("Startled, %s drops %s as it revives!",
			      mon_nam(mcarry), an(cname));
		    else
			pline("%s suddenly appears!", chewed ?
			      Adjmonnam(mtmp, "bite-covered") : Monnam(mtmp));
		}
		break;
	   case OBJ_CONTAINED:
		if (container_where == OBJ_MINVENT && cansee(mtmp->mx, mtmp->my) &&
		    mcarry && canseemon(level, mcarry) && container) {
		        char sackname[BUFSZ];
		        sprintf(sackname, "%s %s", s_suffix(mon_nam(mcarry)),
				xname(container)); 
			pline("%s writhes out of %s!", Amonnam(mtmp), sackname);
		} else if (container_where == OBJ_INVENT && container) {
		        char sackname[BUFSZ];
		        strcpy(sackname, an(xname(container)));
			pline("%s %s out of %s in your pack!",
				Blind ? "Something" : Amonnam(mtmp),
				locomotion(mtmp->data,"writhes"),
				sackname);
		} else if (container_where == OBJ_FLOOR && container &&
		            cansee(mtmp->mx, mtmp->my)) {
		        char sackname[BUFSZ];
		        strcpy(sackname, an(xname(container)));
			pline("%s escapes from %s!", Amonnam(mtmp), sackname);
		}
		break;
	    default:
		/* we should be able to handle the other cases... */
		impossible("revive_corpse: lost corpse @ %d", where);
		break;
	}
	return TRUE;
    }
    return FALSE;
}